

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::UndoReadFromDisk(BlockManager *this,CBlockUndo *blockundo,CBlockIndex *index)

{
  long lVar1;
  uint256 *puVar2;
  FILE *pFVar3;
  uint uVar4;
  bool bVar5;
  _Alloc_hider _Var6;
  FlatFilePos FVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  AutoFile local_118;
  FlatFilePos pos;
  VectorFormatter<DefaultFormatter> local_e9;
  string local_e8;
  HashVerifier<AutoFile> verifier;
  uint256 hashChecksum;
  size_t __nbytes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  verifier.super_HashWriter.ctx.s._0_8_ = &cs_main;
  verifier.super_HashWriter.ctx.s[2]._0_1_ = 0;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&verifier);
  uVar4 = index->nStatus & 0x10;
  __nbytes = (size_t)uVar4;
  FVar7.nFile = -(uint)(uVar4 == 0) | index->nFile;
  FVar7.nPos = (int)(index->nStatus << 0x1b) >> 0x1f & index->nUndoPos;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&verifier);
  pos = FVar7;
  pFVar3 = FlatFileSeq::Open(&this->m_undo_file_seq,&pos,true);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&verifier,&this->m_xor_key);
  local_118.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(verifier.super_HashWriter.ctx.s._9_7_,
                         (undefined1)verifier.super_HashWriter.ctx.s[2]);
  local_118.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)verifier.super_HashWriter.ctx.s._0_8_;
  local_118.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)verifier.super_HashWriter.ctx.s._16_8_;
  local_118.m_file = pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20ff88;
    FlatFilePos::ToString_abi_cxx11_((string *)&verifier,&pos);
    logging_function_00._M_str = "UndoReadFromDisk";
    logging_function_00._M_len = 0x10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,0x2c6,MEMPOOL,0x815483,"UndoReadFromDisk",
               (char (*) [17])&verifier,pbVar10);
    _Var6._M_p = (pointer)verifier.super_HashWriter.ctx.s._0_8_;
    if ((uint32_t *)verifier.super_HashWriter.ctx.s._0_8_ != verifier.super_HashWriter.ctx.s + 4) {
LAB_0020ffd6:
      operator_delete(_Var6._M_p,verifier.super_HashWriter.ctx.s._16_8_ + 1);
    }
  }
  else {
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hashChecksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &local_118;
    puVar2 = index->pprev->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    local_e8._M_dataplus._M_p = *(pointer *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    local_e8._M_string_length = *(size_type *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_e8.field_2._M_allocated_capacity =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_e8.field_2._8_8_ = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18)
    ;
    CSHA256::Write((CSHA256 *)&verifier,(uchar *)&local_e8,0x20);
    VectorFormatter<DefaultFormatter>::
    Unser<HashVerifier<AutoFile>,std::vector<CTxUndo,std::allocator<CTxUndo>>>
              (&local_e9,&verifier,&blockundo->vtxundo);
    AutoFile::read(&local_118,(int)&hashChecksum,(void *)0x20,__nbytes);
    HashWriter::GetHash((uint256 *)&local_e8,&verifier.super_HashWriter);
    auVar9[0] = -(local_e8.field_2._M_local_buf[0] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar9[1] = -(local_e8.field_2._M_local_buf[1] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar9[2] = -(local_e8.field_2._M_local_buf[2] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar9[3] = -(local_e8.field_2._M_local_buf[3] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar9[4] = -(local_e8.field_2._M_local_buf[4] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar9[5] = -(local_e8.field_2._M_local_buf[5] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar9[6] = -(local_e8.field_2._M_local_buf[6] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar9[7] = -(local_e8.field_2._M_local_buf[7] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar9[8] = -(local_e8.field_2._M_local_buf[8] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar9[9] = -(local_e8.field_2._M_local_buf[9] ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar9[10] = -(local_e8.field_2._M_local_buf[10] ==
                  hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar9[0xb] = -(local_e8.field_2._M_local_buf[0xb] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar9[0xc] = -(local_e8.field_2._M_local_buf[0xc] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar9[0xd] = -(local_e8.field_2._M_local_buf[0xd] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar9[0xe] = -(local_e8.field_2._M_local_buf[0xe] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar9[0xf] = -(local_e8.field_2._M_local_buf[0xf] ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar8[0] = -((uchar)local_e8._M_dataplus._M_p ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[0]);
    auVar8[1] = -(local_e8._M_dataplus._M_p._1_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[1]);
    auVar8[2] = -(local_e8._M_dataplus._M_p._2_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[2]);
    auVar8[3] = -(local_e8._M_dataplus._M_p._3_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[3]);
    auVar8[4] = -(local_e8._M_dataplus._M_p._4_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[4]);
    auVar8[5] = -(local_e8._M_dataplus._M_p._5_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[5]);
    auVar8[6] = -(local_e8._M_dataplus._M_p._6_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[6]);
    auVar8[7] = -(local_e8._M_dataplus._M_p._7_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[7]);
    auVar8[8] = -((uchar)local_e8._M_string_length ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[8]);
    auVar8[9] = -(local_e8._M_string_length._1_1_ ==
                 hashChecksum.super_base_blob<256U>.m_data._M_elems[9]);
    auVar8[10] = -(local_e8._M_string_length._2_1_ ==
                  hashChecksum.super_base_blob<256U>.m_data._M_elems[10]);
    auVar8[0xb] = -(local_e8._M_string_length._3_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar8[0xc] = -(local_e8._M_string_length._4_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar8[0xd] = -(local_e8._M_string_length._5_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar8[0xe] = -(local_e8._M_string_length._6_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar8[0xf] = -(local_e8._M_string_length._7_1_ ==
                   hashChecksum.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar8 = auVar8 & auVar9;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
      bVar5 = true;
      goto LAB_0020ffe4;
    }
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20ff26;
    FlatFilePos::ToString_abi_cxx11_(&local_e8,&pos);
    logging_function._M_str = "UndoReadFromDisk";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function,source_file,0x2d8,MEMPOOL,0x8154cc,"UndoReadFromDisk",
               (char (*) [17])&local_e8,pbVar10);
    verifier.super_HashWriter.ctx.s._16_8_ = local_e8.field_2._M_allocated_capacity;
    _Var6._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_0020ffd6;
  }
  bVar5 = false;
LAB_0020ffe4:
  AutoFile::~AutoFile(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool BlockManager::UndoReadFromDisk(CBlockUndo& blockundo, const CBlockIndex& index) const
{
    const FlatFilePos pos{WITH_LOCK(::cs_main, return index.GetUndoPos())};

    // Open history file to read
    AutoFile filein{OpenUndoFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenUndoFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    uint256 hashChecksum;
    HashVerifier verifier{filein}; // Use HashVerifier as reserializing may lose data, c.f. commit d342424301013ec47dc146a4beb49d5c9319d80a
    try {
        verifier << index.pprev->GetBlockHash();
        verifier >> blockundo;
        filein >> hashChecksum;
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Verify checksum
    if (hashChecksum != verifier.GetHash()) {
        LogError("%s: Checksum mismatch at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}